

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_91799c::Target::DumpSourceGroups(Value *__return_storage_ptr__,Target *this)

{
  bool bVar1;
  Value local_68;
  reference local_40;
  SourceGroup *sg;
  iterator __end1;
  iterator __begin1;
  vector<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
  *__range1;
  Target *this_local;
  Value *sourceGroups;
  
  Json::Value::Value(__return_storage_ptr__,arrayValue);
  __end1 = std::
           vector<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
           ::begin(&this->SourceGroups);
  sg = (SourceGroup *)
       std::
       vector<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>
       ::end(&this->SourceGroups);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<(anonymous_namespace)::Target::SourceGroup_*,_std::vector<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>_>
                                     *)&sg), bVar1) {
    local_40 = __gnu_cxx::
               __normal_iterator<(anonymous_namespace)::Target::SourceGroup_*,_std::vector<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>_>
               ::operator*(&__end1);
    DumpSourceGroup(&local_68,this,local_40);
    Json::Value::append(__return_storage_ptr__,&local_68);
    Json::Value::~Value(&local_68);
    __gnu_cxx::
    __normal_iterator<(anonymous_namespace)::Target::SourceGroup_*,_std::vector<(anonymous_namespace)::Target::SourceGroup,_std::allocator<(anonymous_namespace)::Target::SourceGroup>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpSourceGroups()
{
  Json::Value sourceGroups = Json::arrayValue;
  for (auto& sg : this->SourceGroups) {
    sourceGroups.append(this->DumpSourceGroup(sg));
  }
  return sourceGroups;
}